

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86.cpp
# Opt level: O0

void ncnn::detectron2_pre_calc_for_bilinear_interpolate<float>
               (int height,int width,int pooled_height,int pooled_width,int iy_upper,int ix_upper,
               float roi_start_h,float roi_start_w,float bin_size_h,float bin_size_w,
               int roi_bin_grid_h,int roi_bin_grid_w,
               vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *pre_calc)

{
  reference pvVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int in_stack_00000008;
  PreCalc<float> pc;
  float w4;
  float w3;
  float w2;
  float w1;
  float hx;
  float hy;
  float lx;
  float ly;
  int x_high;
  int y_high;
  int x_low;
  int y_low;
  PreCalc<float> pc_1;
  float y;
  float x;
  float xx;
  int ix;
  float yy;
  int iy;
  int pw;
  int ph;
  int pre_calc_index;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  float local_4c;
  float local_48;
  int local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
        fVar2 = in_XMM0_Da + (float)local_30 * in_XMM2_Da +
                (((float)local_38 + 0.5) * in_XMM2_Da) / (float)in_stack_00000008;
        for (local_40 = 0; local_40 < in_R9D; local_40 = local_40 + 1) {
          local_48 = in_XMM1_Da + (float)local_34 * in_XMM3_Da +
                     (((float)local_40 + 0.5) * in_XMM3_Da) / (float)pc.pos2;
          if ((((fVar2 < -1.0) || ((float)in_EDI < fVar2)) || (local_48 < -1.0)) ||
             ((float)in_ESI < local_48)) {
            pvVar1 = std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::
                     operator[]((vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                 *)pc._12_8_,(long)local_2c);
            pvVar1->pos1 = 0;
            pvVar1->pos2 = 0;
            pvVar1->pos3 = 0;
            pvVar1->pos4 = 0;
            pvVar1->w1 = 0.0;
            pvVar1->w2 = 0.0;
            pvVar1->w3 = 0.0;
            pvVar1->w4 = 0.0;
          }
          else {
            local_4c = fVar2;
            if (fVar2 <= 0.0) {
              local_4c = 0.0;
            }
            if (local_48 <= 0.0) {
              local_48 = 0.0;
            }
            local_70 = (int)local_4c;
            local_74 = (int)local_48;
            if (local_70 < in_EDI + -1) {
              local_78 = local_70 + 1;
            }
            else {
              local_78 = in_EDI + -1;
              local_4c = (float)local_78;
              local_70 = local_78;
            }
            if (local_74 < in_ESI + -1) {
              local_7c = local_74 + 1;
            }
            else {
              local_7c = in_ESI + -1;
              local_48 = (float)local_7c;
              local_74 = local_7c;
            }
            local_4c = local_4c - (float)local_70;
            local_48 = local_48 - (float)local_74;
            pvVar1 = std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::
                     operator[]((vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                 *)pc._12_8_,(long)local_2c);
            pvVar1->pos1 = local_70 * in_ESI + local_74;
            pvVar1->pos2 = local_70 * in_ESI + local_7c;
            pvVar1->pos3 = local_78 * in_ESI + local_74;
            pvVar1->pos4 = local_78 * in_ESI + local_7c;
            pvVar1->w1 = (1.0 - local_4c) * (1.0 - local_48);
            pvVar1->w2 = (1.0 - local_4c) * local_48;
            pvVar1->w3 = local_4c * (1.0 - local_48);
            pvVar1->w4 = local_4c * local_48;
          }
          local_2c = local_2c + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void detectron2_pre_calc_for_bilinear_interpolate(
    const int height,
    const int width,
    const int pooled_height,
    const int pooled_width,
    const int iy_upper,
    const int ix_upper,
    T roi_start_h,
    T roi_start_w,
    T bin_size_h,
    T bin_size_w,
    int roi_bin_grid_h,
    int roi_bin_grid_w,
    std::vector<PreCalc<T> >& pre_calc)
{
    int pre_calc_index = 0;
    for (int ph = 0; ph < pooled_height; ph++)
    {
        for (int pw = 0; pw < pooled_width; pw++)
        {
            for (int iy = 0; iy < iy_upper; iy++)
            {
                const T yy = roi_start_h + ph * bin_size_h + static_cast<T>(iy + .5f) * bin_size_h / static_cast<T>(roi_bin_grid_h); // e.g., 0.5, 1.5
                for (int ix = 0; ix < ix_upper; ix++)
                {
                    const T xx = roi_start_w + pw * bin_size_w + static_cast<T>(ix + .5f) * bin_size_w / static_cast<T>(roi_bin_grid_w);

                    T x = xx;
                    T y = yy;
                    // deal with: inverse elements are out of feature map boundary
                    if (y < -1.0 || y > height || x < -1.0 || x > width)
                    {
                        // empty
                        PreCalc<T> pc;
                        pc.pos1 = 0;
                        pc.pos2 = 0;
                        pc.pos3 = 0;
                        pc.pos4 = 0;
                        pc.w1 = 0;
                        pc.w2 = 0;
                        pc.w3 = 0;
                        pc.w4 = 0;
                        pre_calc[pre_calc_index++] = pc;
                        continue;
                    }

                    if (y <= 0)
                    {
                        y = 0;
                    }
                    if (x <= 0)
                    {
                        x = 0;
                    }

                    int y_low = (int)y;
                    int x_low = (int)x;
                    int y_high;
                    int x_high;

                    if (y_low >= height - 1)
                    {
                        y_high = y_low = height - 1;
                        y = (T)y_low;
                    }
                    else
                    {
                        y_high = y_low + 1;
                    }

                    if (x_low >= width - 1)
                    {
                        x_high = x_low = width - 1;
                        x = (T)x_low;
                    }
                    else
                    {
                        x_high = x_low + 1;
                    }

                    T ly = y - y_low;
                    T lx = x - x_low;
                    T hy = (T)(1. - ly), hx = (T)(1. - lx);
                    T w1 = hy * hx, w2 = hy * lx, w3 = ly * hx, w4 = ly * lx;

                    // save weights and indices
                    PreCalc<T> pc;
                    pc.pos1 = y_low * width + x_low;
                    pc.pos2 = y_low * width + x_high;
                    pc.pos3 = y_high * width + x_low;
                    pc.pos4 = y_high * width + x_high;
                    pc.w1 = w1;
                    pc.w2 = w2;
                    pc.w3 = w3;
                    pc.w4 = w4;
                    pre_calc[pre_calc_index++] = pc;
                }
            }
        }
    }
}